

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O0

void __thiscall
omp_tuple_map_pair_multiple_pair_Test::TestBody(omp_tuple_map_pair_multiple_pair_Test *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_double>_> *lhs;
  char *pcVar2;
  __tuple_element_t<1UL,_tuple<int,_double>_> *lhs_00;
  AssertHelper local_d0;
  Message local_c8;
  double local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a0;
  Message local_98 [3];
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  tuple<int,_double> result;
  int local_44;
  undefined1 local_40 [8];
  pair<int,_double> expected2;
  int local_24;
  undefined1 local_20 [8];
  pair<int,_double> expected1;
  omp_tuple_map_pair_multiple_pair_Test *this_local;
  
  local_24 = 1;
  expected2.second = 2.0;
  expected1.second = (double)this;
  std::pair<int,_double>::pair<int,_double,_true>
            ((pair<int,_double> *)local_20,&local_24,&expected2.second);
  local_44 = 3;
  result.super__Tuple_impl<0UL,_int,_double>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  result.super__Tuple_impl<0UL,_int,_double>._12_4_ = 0x40140000;
  std::pair<int,_double>::pair<int,_double,_true>
            ((pair<int,_double> *)local_40,&local_44,
             (double *)&result.super__Tuple_impl<0UL,_int,_double>.super__Head_base<0UL,_int,_false>
            );
  omp::
  tuple_map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_CallOfCrutches[P]omp_utils_tests_omp_utils_tuple_map_reduce_tests_cpp:173:7),_std::pair<int,_double>_&,_std::pair<int,_double>_&,_0>
            ((omp *)local_60,
             (anon_class_1_0_00000001 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),(pair<int,_double> *)local_20,(pair<int,_double> *)local_40);
  lhs = std::get<0ul,int,double>((tuple<int,_double> *)local_60);
  local_7c = local_20._0_4_ + local_40._0_4_;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_78,"std::get<0>(result)","(expected1.first + expected2.first)",lhs,
             &local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(local_98);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    lhs_00 = std::get<1ul,int,double>((tuple<int,_double> *)local_60);
    local_c0 = (double)expected1._0_8_ + (double)expected2._0_8_;
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_b8,"std::get<1>(result)","(expected1.second + expected2.second)",
               lhs_00,&local_c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
                 ,0xb0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  }
  return;
}

Assistant:

TEST(omp_tuple_map_pair, multiple_pair) {
  auto expected1 = std::pair(1, 2.0);
  auto expected2 = std::pair(3, 5.0);

  auto result = omp::tuple_map(
      [](auto &val1, auto &val2) { return val1 + val2; }, expected1, expected2);

  ASSERT_EQ(std::get<0>(result), (expected1.first + expected2.first));
  ASSERT_EQ(std::get<1>(result), (expected1.second + expected2.second));
}